

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

UnicodeString * icu_63::tokenString(UnicodeString *__return_storage_ptr__,tokenType tok)

{
  UnicodeString *pUVar1;
  UChar local_1c [6];
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e5ab8;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  switch(tok) {
  case tVariableN:
    local_1c[0] = L'n';
    pUVar1 = UnicodeString::doAppend(__return_storage_ptr__,local_1c,0,1);
    break;
  case tVariableI:
    local_1c[1] = 0x69;
    pUVar1 = UnicodeString::doAppend(__return_storage_ptr__,local_1c + 1,0,1);
    break;
  case tVariableF:
    local_1c[2] = 0x66;
    pUVar1 = UnicodeString::doAppend(__return_storage_ptr__,local_1c + 2,0,1);
    break;
  case tVariableV:
    local_1c[3] = 0x76;
    pUVar1 = UnicodeString::doAppend(__return_storage_ptr__,local_1c + 3,0,1);
    break;
  case tVariableT:
    local_1c[4] = 0x74;
    pUVar1 = UnicodeString::doAppend(__return_storage_ptr__,local_1c + 4,0,1);
    break;
  default:
    local_1c[5] = 0x7e;
    pUVar1 = UnicodeString::doAppend(__return_storage_ptr__,local_1c + 5,0,1);
  }
  return pUVar1;
}

Assistant:

static UnicodeString tokenString(tokenType tok) {
    UnicodeString s;
    switch (tok) {
      case tVariableN:
        s.append(LOW_N); break;
      case tVariableI:
        s.append(LOW_I); break;
      case tVariableF:
        s.append(LOW_F); break;
      case tVariableV:
        s.append(LOW_V); break;
      case tVariableT:
        s.append(LOW_T); break;
      default:
        s.append(TILDE);
    }
    return s;
}